

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_policy_storage_batch.c
# Opt level: O0

int log_policy_storage_batch_destroy(log_policy policy)

{
  long *__ptr;
  log_policy in_RDI;
  log_policy_storage_batch_data batch_data;
  
  __ptr = (long *)log_policy_instance(in_RDI);
  if (__ptr != (long *)0x0) {
    if (*__ptr != 0) {
      free((void *)*__ptr);
    }
    free(__ptr);
  }
  return 0;
}

Assistant:

static int log_policy_storage_batch_destroy(log_policy policy)
{
	log_policy_storage_batch_data batch_data = log_policy_instance(policy);

	if (batch_data != NULL)
	{
		if (batch_data->buffer != NULL)
		{
			free(batch_data->buffer);
		}

		free(batch_data);
	}

	return 0;
}